

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O2

void __thiscall bwtil::PartialSums::increment(PartialSums *this,symbol s)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  
  bVar2 = s % this->d;
  uVar4 = (uint)(s / this->d) + ((uint)this->nr_of_nodes - (uint)this->nr_of_leafs);
  while( true ) {
    incrementFrom(this,&this->nodes,(ulong)uVar4,(uint)bVar2);
    if (uVar4 == 0) break;
    iVar3 = this->d + 1;
    lVar1 = (long)(int)((uVar4 & 0xffff) - 1) % (long)iVar3;
    bVar2 = (byte)lVar1;
    uVar4 = (int)((uVar4 & 0xffff) + ~(uint)lVar1) / iVar3 & 0xffff;
  }
  return;
}

Assistant:

void increment(symbol s){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): increment() called on empty counter\n";
			exit(0);
		}
	#endif

	#ifdef DEBUG
		if(s>=sigma){
			cout << "ERROR (PartialSums): symbol " << s << " not in alphabet.\n";
			exit(0);
		}
	#endif

		uint current_node = (nr_of_nodes - nr_of_leafs) + (s/d);//offset leafs + leaf number
		uint offset_in_node = s%d;//number of the counter inside the node

		incrementFrom(&nodes, current_node, offset_in_node);//increment counters in the leaf

		while(current_node>0){//repeat while current node is not the root

			offset_in_node = childNumber(current_node);
			current_node = parent(current_node);

			incrementFrom(&nodes, current_node, offset_in_node);

		}

	}